

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSMFPlay.cpp
# Opt level: O3

void __thiscall dsa::CSMFPlay::Start(CSMFPlay *this,bool reset)

{
  pointer *ppCVar1;
  pointer piVar2;
  pointer pCVar3;
  iterator __position;
  iterator __position_00;
  uint uVar4;
  ulong uVar5;
  undefined7 in_register_00000031;
  CMIDIModule *this_00;
  long lVar6;
  CSMFEvent local_50;
  
  if (((int)CONCAT71(in_register_00000031,reset) != 0) && (0 < this->m_mods)) {
    this_00 = (CMIDIModule *)&this->field_0x30;
    lVar6 = 0;
    do {
      CMIDIModule::Reset(this_00);
      lVar6 = lVar6 + 1;
      this_00 = this_00 + 1;
    } while (lVar6 < this->m_mods);
  }
  this->m_tempo = 500000;
  this->m_time_rest = 0.0;
  this->rendered_ticks = 0;
  this->wanted_ticks = 0;
  piVar2 = (this->m_delta).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_delta).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar2) {
    (this->m_delta).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar2;
  }
  (this->m_end_flag).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p =
       (this->m_end_flag).super__Bvector_base<std::allocator<bool>_>._M_impl.
       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  (this->m_end_flag).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  pCVar3 = (this->m_event).super__Vector_base<dsa::CSMFEvent,_std::allocator<dsa::CSMFEvent>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_event).super__Vector_base<dsa::CSMFEvent,_std::allocator<dsa::CSMFEvent>_>._M_impl.
      super__Vector_impl_data._M_finish != pCVar3) {
    (this->m_event).super__Vector_base<dsa::CSMFEvent,_std::allocator<dsa::CSMFEvent>_>._M_impl.
    super__Vector_impl_data._M_finish = pCVar3;
  }
  uVar4 = (uint)(this->m_smf).m_track_num;
  this->m_playing_tracks = uVar4;
  if (uVar4 != 0) {
    lVar6 = 0;
    uVar5 = 0;
    do {
      (this->m_smf).m_MTrk_ptr[uVar5] = 0;
      local_50.m_delta._0_4_ = 0;
      __position._M_current =
           (this->m_delta).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_delta).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&this->m_delta,__position,(int *)&local_50);
      }
      else {
        *__position._M_current = 0;
        (this->m_delta).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      std::vector<bool,_std::allocator<bool>_>::push_back(&this->m_end_flag,false);
      CSMF::ReadNextEvent(&local_50,&this->m_smf,(int)uVar5);
      __position_00._M_current =
           (this->m_event).super__Vector_base<dsa::CSMFEvent,_std::allocator<dsa::CSMFEvent>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position_00._M_current ==
          (this->m_event).super__Vector_base<dsa::CSMFEvent,_std::allocator<dsa::CSMFEvent>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<dsa::CSMFEvent,_std::allocator<dsa::CSMFEvent>_>::
        _M_realloc_insert<dsa::CSMFEvent>(&this->m_event,__position_00,&local_50);
      }
      else {
        (__position_00._M_current)->m_data = local_50.m_data;
        (__position_00._M_current)->m_length = local_50.m_length;
        (__position_00._M_current)->m_delta =
             CONCAT44(local_50.m_delta._4_4_,(undefined4)local_50.m_delta);
        (__position_00._M_current)->m_type = local_50.m_type;
        (__position_00._M_current)->m_running = local_50.m_running;
        (__position_00._M_current)->field_0xd = local_50._13_1_;
        (__position_00._M_current)->m_status = local_50.m_status;
        ppCVar1 = &(this->m_event).
                   super__Vector_base<dsa::CSMFEvent,_std::allocator<dsa::CSMFEvent>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppCVar1 = *ppCVar1 + 1;
      }
      (this->m_delta).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar5] =
           *(int *)((long)&((this->m_event).
                            super__Vector_base<dsa::CSMFEvent,_std::allocator<dsa::CSMFEvent>_>.
                            _M_impl.super__Vector_impl_data._M_start)->m_delta + lVar6);
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 0x20;
    } while (uVar5 < (this->m_smf).m_track_num);
  }
  return;
}

Assistant:

void CSMFPlay::Start(bool reset) {

  if (reset) for(int i=0;i<m_mods;i++) m_module[i].Reset();

  m_tempo = (60*1000000)/120;
  m_time_rest = 0.0;

  rendered_ticks = 0;
  wanted_ticks = 0;

  m_delta.clear();
  m_end_flag.clear();
  m_event.clear();

  m_playing_tracks = m_smf.m_track_num;

  for(int trk=0; trk<m_smf.m_track_num; trk++) {
    m_smf.Seek(trk,0);
    m_delta.push_back(0);
    m_end_flag.push_back(false);
    try {
      m_event.push_back(m_smf.ReadNextEvent(trk));
	  m_delta[trk] = m_event[trk].m_delta;
    } catch (CSMF_Exception) {
      m_end_flag[trk] = true;
    }
  }
}